

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

set<double,_std::less<double>,_std::allocator<double>_> * __thiscall
CMU462::DynamicScene::Skeleton::load
          (set<double,_std::less<double>,_std::allocator<double>_> *__return_storage_ptr__,
          Skeleton *this,char *filename)

{
  _Rb_tree_header *p_Var1;
  pointer ppJVar2;
  XMLError XVar3;
  ostream *poVar4;
  XMLElement *jointNode;
  Joint *pJVar5;
  XMLDocument xmlDoc;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  poVar4 = std::operator<<((ostream *)&std::cerr,"Loading skeleton from file ");
  poVar4 = std::operator<<(poVar4,filename);
  std::endl<char,std::char_traits<char>>(poVar4);
  tinyxml2::XMLDocument::XMLDocument(&xmlDoc,true,PRESERVE_WHITESPACE);
  XVar3 = tinyxml2::XMLDocument::LoadFile(&xmlDoc,filename);
  if (XVar3 != XML_NO_ERROR) {
    printf("Error: %i\n",(ulong)XVar3);
  }
  if (xmlDoc.super_XMLNode._firstChild == (XMLNode *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Skeleton file is not a valid XML file.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    jointNode = tinyxml2::XMLNode::FirstChildElement(xmlDoc.super_XMLNode._firstChild,"Joint");
    if (jointNode == (XMLElement *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Root joint does not exist.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      ppJVar2 = (this->joints).
                super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->joints).
          super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppJVar2) {
        (this->joints).
        super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppJVar2;
      }
      pJVar5 = loadJoint(this,jointNode,__return_storage_ptr__);
      this->root = pJVar5;
      pJVar5->parent = (Joint *)0x0;
    }
  }
  tinyxml2::XMLDocument::~XMLDocument(&xmlDoc);
  return __return_storage_ptr__;
}

Assistant:

set<double> Skeleton::load(const char * filename)
   {
     set<double> knotTimes;
     cerr << "Loading skeleton from file " << filename << endl;
     XMLDocument xmlDoc;
     XMLError eResult = xmlDoc.LoadFile(filename);
     XMLCheckResult(eResult);

     XMLNode* pRoot = xmlDoc.FirstChild();
     if (pRoot == nullptr)
     {
       cout << "Skeleton file is not a valid XML file." << endl;
       return knotTimes;
     }

     XMLElement * pElement = pRoot->FirstChildElement("Joint");
     if (pElement == nullptr)
     {
       cout << "Root joint does not exist." << endl;
       return knotTimes;
     }

     // clear skeleton and create a new one
     joints.clear();
     root = loadJoint(pElement, knotTimes);
     root->parent = nullptr;

     return knotTimes;
   }